

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

int Gia_ManOrderWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_0078263d;
  iVar2 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar4 = 0;
  if (p->pTravIds[iVar2] != p->nTravIds) {
    p->pTravIds[iVar2] = p->nTravIds;
    uVar5 = (uint)*(undefined8 *)pObj;
    uVar6 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    if ((~uVar5 & 0x9fffffff) == 0) {
      p->iData2 = uVar6 & 0x1fffffff;
      iVar4 = 1;
    }
    else {
      if (((int)uVar5 < 0) ||
         (uVar3 = (ulong)(uVar5 & 0x1fffffff), (uVar5 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x10b,"int Gia_ManOrderWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
        ;
      }
      if (((uVar5 & 0x1fffffff) == 0x1fffffff) || ((uVar5 & 0x1fffffff) != (uVar6 & 0x1fffffff))) {
        if (pGVar1 + p->nObjs <= pObj) goto LAB_0078263d;
        if (p->pSibls != (int *)0x0) {
          uVar5 = p->pSibls[iVar2];
          if ((ulong)uVar5 != 0) {
            if (((int)uVar5 < 0) || (p->nObjs <= (int)uVar5)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            iVar2 = Gia_ManOrderWithBoxes_rec(p,pGVar1 + uVar5,vNodes);
            if (iVar2 != 0) {
              return 1;
            }
            uVar3 = (ulong)((uint)*(undefined8 *)pObj & 0x1fffffff);
          }
        }
        iVar2 = Gia_ManOrderWithBoxes_rec(p,pObj + -uVar3,vNodes);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = Gia_ManOrderWithBoxes_rec
                          (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = Gia_ObjId(p,pObj);
      }
      else {
        iVar2 = Gia_ManOrderWithBoxes_rec(p,pObj + -uVar3,vNodes);
        if (iVar2 != 0) {
          return 1;
        }
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_0078263d:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar2 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
      }
      Vec_IntPush(vNodes,iVar2);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int Gia_ManOrderWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        p->iData2 = Gia_ObjCioId(pObj);
        return 1;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsBuf(pObj) )
    {
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
            return 1;
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return 0;
    }
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), vNodes ) )
            return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
        return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin1(pObj), vNodes ) )
        return 1;
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    return 0;
}